

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::IntDigits::
PrintAsHexLower<unsigned_long_long>(IntDigits *this,unsigned_long_long v)

{
  undefined2 uVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar4 = &this->field_0x3d;
  do {
    pcVar3 = pcVar4;
    uVar1 = *(undefined2 *)(numbers_internal::kHexTable + (v & 0xff) * 2);
    *(undefined2 *)(pcVar3 + -3) = uVar1;
    bVar2 = 0xff < v;
    pcVar4 = pcVar3 + -2;
    v = v >> 8;
  } while (bVar2);
  pcVar4 = pcVar3 + -3;
  if ((char)uVar1 == '0') {
    pcVar4 = pcVar3 + -2;
  }
  this->start_ = pcVar4;
  this->size_ = (long)this + (0x3c - (long)pcVar4);
  return;
}

Assistant:

void PrintAsHexLower(T v) {
    static_assert(!IsSigned<T>::value, "");
    char *p = storage_ + sizeof(storage_);

    do {
      p -= 2;
      constexpr const char* table = numbers_internal::kHexTable;
      std::memcpy(p, table + 2 * (static_cast<size_t>(v) & 0xFF), 2);
      if (sizeof(T) == 1) break;
      v >>= 8;
    } while (v);
    if (p[0] == '0') {
      // We printed one too many digits.
      ++p;
    }
    start_ = p;
    size_ = static_cast<size_t>(storage_ + sizeof(storage_) - p);
  }